

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O3

int setsockopt_txtime(int fd)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  char *pcVar4;
  socklen_t vallen;
  int so_mark_val_read;
  sock_txtime so_txtime_val_read;
  sock_txtime so_txtime_val;
  socklen_t local_20;
  undefined1 local_1c [4];
  long local_18;
  long local_10;
  
  local_10 = 0x20000000b;
  iVar1 = setsockopt(fd,1,0x3d,&local_10,8);
  if (iVar1 == 0) {
    local_20 = 8;
    iVar1 = getsockopt(fd,1,0x3d,&local_18,&local_20);
    if (iVar1 != 0) {
      pcVar4 = "getsockopt() SO_TXTIME";
LAB_00102fdb:
      perror(pcVar4);
      piVar2 = __errno_location();
      return -*piVar2;
    }
    if ((local_20 == 8) && (local_10 == local_18)) {
      iVar1 = setsockopt(fd,1,0x24,&so_mark_val,4);
      if (iVar1 != 0) {
        plVar3 = (long *)local_1c;
        setsockopt_txtime_cold_2();
        goto LAB_00102fd0;
      }
      local_20 = 4;
      iVar1 = getsockopt(fd,1,0x24,local_1c,&local_20);
      if (iVar1 != 0) {
        pcVar4 = "getsockopt() SO_MARK";
        goto LAB_00102fdb;
      }
      if ((local_20 == 4) && ((undefined1  [4])so_mark_val == local_1c)) {
        return 0;
      }
      pcVar4 = "getsockopt() SO_MARK: mismatch";
    }
    else {
      pcVar4 = "getsockopt() SO_TXTIME: mismatch";
    }
    perror(pcVar4);
    iVar1 = -0x16;
  }
  else {
    plVar3 = &local_18;
    setsockopt_txtime_cold_1();
LAB_00102fd0:
    iVar1 = (int)*plVar3;
  }
  return iVar1;
}

Assistant:

static int setsockopt_txtime(int fd)
{
	const struct sock_txtime so_txtime_val = {
		.clockid = clockid,
		.flags = SOF_TXTIME_REPORT_ERRORS,
	};
	struct sock_txtime so_txtime_val_read;
	int so_mark_val_read;
	socklen_t vallen;
	int ret;

	/* SO_TXTIME */

	ret = setsockopt(fd, SOL_SOCKET, SO_TXTIME,
			 &so_txtime_val, sizeof(so_txtime_val));
	if (ret) {
		int err = errno;

		perror("setsockopt() SO_TXTIME");
		if (err == EPERM)
			fprintf(stderr, "Run with CAP_NET_ADMIN or as root.\n");

		return -err;
	};

	vallen = sizeof(so_txtime_val_read);
	ret = getsockopt(fd, SOL_SOCKET, SO_TXTIME,
			 &so_txtime_val_read, &vallen);
	if (ret) {
		perror("getsockopt() SO_TXTIME");
		return -errno;
	};

	if (vallen != sizeof(so_txtime_val) ||
	    memcmp(&so_txtime_val, &so_txtime_val_read, vallen)) {
		perror("getsockopt() SO_TXTIME: mismatch");
		return -EINVAL;
	}

	/* SO_MARK */

	ret = setsockopt(fd, SOL_SOCKET, SO_MARK, &so_mark_val, sizeof(so_mark_val));
	if (ret) {
		int err = errno;

		perror("setsockopt() SO_MARK");
		if (err == EPERM)
			fprintf(stderr, "Run with CAP_NET_ADMIN or as root.\n");

		return -err;
	};

	vallen = sizeof(so_mark_val_read);
	ret = getsockopt(fd, SOL_SOCKET, SO_MARK,
			 &so_mark_val_read, &vallen);
	if (ret) {
		perror("getsockopt() SO_MARK");
		return -errno;
	};

	if (vallen != sizeof(so_mark_val) ||
	    memcmp(&so_mark_val, &so_mark_val_read, vallen)) {
		perror("getsockopt() SO_MARK: mismatch");
		return -EINVAL;
	}

	return 0;
}